

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::Copy(BVFixed *this,BVFixed *bv)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  BVFixed *bv_local;
  BVFixed *this_local;
  
  AssertBV(this,bv);
  if (this->len < bv->len) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0xf3,"(len >= bv->len)","len >= bv->len");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = WordCount(this);
  BVar4 = WordCount(bv);
  js_memcpy_s(this + 1,(ulong)BVar3 << 3,bv + 1,(ulong)BVar4 << 3);
  return;
}

Assistant:

void
BVFixed::Copy(const BVFixed*bv)
{
    AssertBV(bv);
    Assert(len >= bv->len);

#if 1
    js_memcpy_s(&this->data[0], WordCount() * sizeof(BVUnit), &bv->data[0], bv->WordCount() * sizeof(BVUnit));
#else
    this->for_each(bv, &BVUnit::Copy);
#endif
}